

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pf_buffermgr.cc
# Opt level: O3

RC __thiscall PF_BufferMgr::UnpinPage(PF_BufferMgr *this,int fd,PageNum pageNum)

{
  int iVar1;
  PF_BufPageDesc *pPVar2;
  RC RVar3;
  undefined8 in_RAX;
  short sVar4;
  int slot;
  int local_14;
  
  local_14 = (int)((ulong)in_RAX >> 0x20);
  RVar3 = PF_HashTable::Find(&this->hashTable,fd,pageNum,&local_14);
  if (RVar3 == -8) {
    RVar3 = 2;
  }
  else if (RVar3 == 0) {
    sVar4 = this->bufTable[local_14].pinCount;
    if (sVar4 == 0) {
      RVar3 = 7;
    }
    else {
      sVar4 = sVar4 + -1;
      this->bufTable[local_14].pinCount = sVar4;
      RVar3 = 0;
      if (sVar4 == 0) {
        Unlink(this,local_14);
        iVar1 = this->first;
        pPVar2 = this->bufTable;
        pPVar2[local_14].next = iVar1;
        pPVar2[local_14].prev = -1;
        if ((long)iVar1 != -1) {
          pPVar2[iVar1].prev = local_14;
        }
        this->first = local_14;
        if (this->last == -1) {
          this->last = local_14;
          RVar3 = 0;
        }
      }
    }
  }
  return RVar3;
}

Assistant:

RC PF_BufferMgr::UnpinPage(int fd, PageNum pageNum)
{
   RC  rc;       // return code
   int slot;     // buffer slot where page is located

   // The page must be found and pinned in the buffer
   if ((rc = hashTable.Find(fd, pageNum, slot))){
      if ((rc == PF_HASHNOTFOUND))
         return (PF_PAGENOTINBUF);
      else
         return (rc);              // unexpected error
   }

   if (bufTable[slot].pinCount == 0)
      return (PF_PAGEUNPINNED);

#ifdef PF_LOG
   char psMessage[100];
   sprintf (psMessage, "Unpinning (%d,%d). %d Pin count\n",
         fd, pageNum, bufTable[slot].pinCount-1);
   WriteLog(psMessage);
#endif

   // If unpinning the last pin, make it the most recently used page
   if (--(bufTable[slot].pinCount) == 0) {
      if ((rc = Unlink(slot)) ||
            (rc = LinkHead (slot)))
         return (rc);
   }

   // Return ok
   return (0);
}